

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_word_matcher.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
assert_word_matcher<boost::xpressive::detail::word_begin,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::assert_word_matcher
          (assert_word_matcher<boost::xpressive::detail::word_begin,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char acVar1 [2];
  undefined8 in_RSI;
  char (*in_RDI) [2];
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *unaff_retaddr;
  
  acVar1 = (char  [2])
           lookup_classname<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,2ul>
                     (unaff_retaddr,in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  *in_RDI = acVar1;
  return;
}

Assistant:

assert_word_matcher(Traits const &tr)
          : word_(lookup_classname(tr, "w"))
        {
            BOOST_ASSERT(0 != this->word_);
        }